

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O3

void empty_opendir_cb(uv_fs_t *req)

{
  void *dir;
  char *__s1;
  int iVar1;
  uv_loop_t *puVar2;
  uv_fs_t *loop;
  uv_fs_t *req_00;
  long lVar3;
  uv_fs_t uStack_900;
  uv_loop_t *puStack_748;
  uv_fs_t uStack_738;
  undefined1 auStack_580 [880];
  uv_fs_t uStack_210;
  uv_loop_t *puStack_58;
  
  dir = opendir_req.ptr;
  if (req == &opendir_req) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_00157e53;
    if (opendir_req.result != 0) goto LAB_00157e58;
    if (opendir_req.ptr == (void *)0x0) goto LAB_00157e5d;
    *(uv_dirent_t **)opendir_req.ptr = dirents;
    *(undefined8 *)((long)dir + 8) = 1;
    puVar2 = uv_default_loop();
    iVar1 = uv_fs_readdir(puVar2,&readdir_req,(uv_dir_t *)dir,empty_readdir_cb);
    if (iVar1 == 0) {
      uv_fs_req_cleanup(&opendir_req);
      empty_opendir_cb_count = empty_opendir_cb_count + 1;
      return;
    }
  }
  else {
    empty_opendir_cb_cold_1();
LAB_00157e53:
    empty_opendir_cb_cold_2();
LAB_00157e58:
    empty_opendir_cb_cold_3();
LAB_00157e5d:
    empty_opendir_cb_cold_5();
  }
  empty_opendir_cb_cold_4();
  memset(&opendir_req,0xdb,0x1b8);
  puVar2 = uv_default_loop();
  iVar1 = uv_fs_opendir(puVar2,&opendir_req,"./non-existing-dir/",(uv_fs_cb)0x0);
  if (iVar1 == -2) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_00157f71;
    if (opendir_req.result != -2) goto LAB_00157f76;
    if (opendir_req.ptr != (void *)0x0) goto LAB_00157f7b;
    uv_fs_req_cleanup(&opendir_req);
    memset(&opendir_req,0xdb,0x1b8);
    puVar2 = uv_default_loop();
    iVar1 = uv_fs_opendir(puVar2,&opendir_req,"./non-existing-dir/",non_existing_opendir_cb);
    if (iVar1 != 0) goto LAB_00157f80;
    if (non_existing_opendir_cb_count != 0) goto LAB_00157f85;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00157f8a;
    if (non_existing_opendir_cb_count != 1) goto LAB_00157f8f;
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    run_test_fs_readdir_non_existing_dir_cold_1();
LAB_00157f71:
    run_test_fs_readdir_non_existing_dir_cold_2();
LAB_00157f76:
    run_test_fs_readdir_non_existing_dir_cold_3();
LAB_00157f7b:
    run_test_fs_readdir_non_existing_dir_cold_4();
LAB_00157f80:
    run_test_fs_readdir_non_existing_dir_cold_5();
LAB_00157f85:
    run_test_fs_readdir_non_existing_dir_cold_6();
LAB_00157f8a:
    run_test_fs_readdir_non_existing_dir_cold_7();
LAB_00157f8f:
    run_test_fs_readdir_non_existing_dir_cold_8();
  }
  run_test_fs_readdir_non_existing_dir_cold_9();
  if (puVar2 == (uv_loop_t *)&opendir_req) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_00157fdc;
    if (opendir_req.result != -2) goto LAB_00157fe1;
    if (opendir_req.ptr == (void *)0x0) {
      uv_fs_req_cleanup(&opendir_req);
      non_existing_opendir_cb_count = non_existing_opendir_cb_count + 1;
      return;
    }
  }
  else {
    non_existing_opendir_cb_cold_1();
LAB_00157fdc:
    non_existing_opendir_cb_cold_2();
LAB_00157fe1:
    non_existing_opendir_cb_cold_3();
  }
  non_existing_opendir_cb_cold_4();
  memset(&opendir_req,0xdb,0x1b8);
  puVar2 = uv_default_loop();
  iVar1 = uv_fs_opendir(puVar2,&opendir_req,"test/fixtures/empty_file",(uv_fs_cb)0x0);
  if (iVar1 == -0x14) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_001580f5;
    if (opendir_req.result != -0x14) goto LAB_001580fa;
    if (opendir_req.ptr != (void *)0x0) goto LAB_001580ff;
    uv_fs_req_cleanup(&opendir_req);
    memset(&opendir_req,0xdb,0x1b8);
    puVar2 = uv_default_loop();
    iVar1 = uv_fs_opendir(puVar2,&opendir_req,"test/fixtures/empty_file",file_opendir_cb);
    if (iVar1 != 0) goto LAB_00158104;
    if (file_opendir_cb_count != 0) goto LAB_00158109;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0015810e;
    if (file_opendir_cb_count != 1) goto LAB_00158113;
    loop = (uv_fs_t *)uv_default_loop();
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    run_test_fs_readdir_file_cold_1();
LAB_001580f5:
    run_test_fs_readdir_file_cold_2();
LAB_001580fa:
    run_test_fs_readdir_file_cold_3();
LAB_001580ff:
    run_test_fs_readdir_file_cold_4();
LAB_00158104:
    run_test_fs_readdir_file_cold_5();
LAB_00158109:
    run_test_fs_readdir_file_cold_6();
LAB_0015810e:
    run_test_fs_readdir_file_cold_7();
LAB_00158113:
    loop = &opendir_req;
    run_test_fs_readdir_file_cold_8();
  }
  run_test_fs_readdir_file_cold_9();
  if (puVar2 == (uv_loop_t *)&opendir_req) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_00158160;
    if (opendir_req.result != -0x14) goto LAB_00158165;
    if (opendir_req.ptr == (void *)0x0) {
      uv_fs_req_cleanup(&opendir_req);
      file_opendir_cb_count = file_opendir_cb_count + 1;
      return;
    }
  }
  else {
    file_opendir_cb_cold_1();
LAB_00158160:
    file_opendir_cb_cold_2();
LAB_00158165:
    file_opendir_cb_cold_3();
  }
  file_opendir_cb_cold_4();
  puStack_748 = (uv_loop_t *)0x158185;
  puStack_58 = (uv_loop_t *)loop;
  cleanup_test_files();
  puStack_748 = (uv_loop_t *)0x15818a;
  puVar2 = uv_default_loop();
  puStack_748 = (uv_loop_t *)0x1581a9;
  iVar1 = uv_fs_mkdir(puVar2,(uv_fs_t *)(auStack_580 + 0x1b8),"test_dir",0x1ed,(uv_fs_cb)0x0);
  if (iVar1 == 0) {
    puStack_748 = (uv_loop_t *)0x1581b6;
    puVar2 = uv_default_loop();
    puStack_748 = (uv_loop_t *)0x1581db;
    iVar1 = uv_fs_open(puVar2,(uv_fs_t *)auStack_580,"test_dir/file1",0x41,0x180,(uv_fs_cb)0x0);
    req_00 = loop;
    if (iVar1 < 0) goto LAB_00158581;
    req_00 = (uv_fs_t *)auStack_580;
    puStack_748 = (uv_loop_t *)0x1581f3;
    uv_fs_req_cleanup(req_00);
    puStack_748 = (uv_loop_t *)0x1581f8;
    puVar2 = uv_default_loop();
    puStack_748 = (uv_loop_t *)0x15820a;
    iVar1 = uv_fs_close(puVar2,&uStack_738,auStack_580._88_4_,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00158586;
    puStack_748 = (uv_loop_t *)0x15821c;
    uv_fs_req_cleanup(&uStack_738);
    puStack_748 = (uv_loop_t *)0x158221;
    puVar2 = uv_default_loop();
    puStack_748 = (uv_loop_t *)0x158246;
    iVar1 = uv_fs_open(puVar2,(uv_fs_t *)auStack_580,"test_dir/file2",0x41,0x180,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_0015858b;
    req_00 = (uv_fs_t *)auStack_580;
    puStack_748 = (uv_loop_t *)0x15825e;
    uv_fs_req_cleanup(req_00);
    puStack_748 = (uv_loop_t *)0x158263;
    puVar2 = uv_default_loop();
    puStack_748 = (uv_loop_t *)0x158275;
    iVar1 = uv_fs_close(puVar2,&uStack_738,auStack_580._88_4_,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00158590;
    puStack_748 = (uv_loop_t *)0x158287;
    uv_fs_req_cleanup(&uStack_738);
    puStack_748 = (uv_loop_t *)0x15828c;
    puVar2 = uv_default_loop();
    puStack_748 = (uv_loop_t *)0x1582ab;
    iVar1 = uv_fs_mkdir(puVar2,(uv_fs_t *)(auStack_580 + 0x1b8),"test_dir/test_subdir",0x1ed,
                        (uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00158595;
    puStack_748 = (uv_loop_t *)0x1582c0;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_580 + 0x1b8));
    req_00 = &opendir_req;
    puStack_748 = (uv_loop_t *)0x1582d9;
    memset(&opendir_req,0xdb,0x1b8);
    puStack_748 = (uv_loop_t *)0x1582de;
    puVar2 = uv_default_loop();
    puStack_748 = (uv_loop_t *)0x1582f2;
    iVar1 = uv_fs_opendir(puVar2,&opendir_req,"test_dir",(uv_fs_cb)0x0);
    loop = (uv_fs_t *)opendir_req.ptr;
    if (iVar1 != 0) goto LAB_0015859a;
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015859f;
    if (opendir_req.result != 0) goto LAB_001585a4;
    if (opendir_req.ptr == (void *)0x0) goto LAB_001585a9;
    *(uv_dirent_t **)opendir_req.ptr = dirents;
    *(undefined8 *)((long)loop + 8) = 1;
    puStack_748 = (uv_loop_t *)0x158343;
    uv_fs_req_cleanup(&opendir_req);
    puStack_748 = (uv_loop_t *)0x158348;
    puVar2 = uv_default_loop();
    puStack_748 = (uv_loop_t *)0x15835c;
    iVar1 = uv_fs_readdir(puVar2,&readdir_req,(uv_dir_t *)loop,(uv_fs_cb)0x0);
    if (iVar1 == 0) {
LAB_00158577:
      puStack_748 = (uv_loop_t *)0x15857c;
      run_test_fs_readdir_non_empty_dir_cold_21();
      goto LAB_0015857c;
    }
    lVar3 = 3;
    do {
      __s1 = dirents[0].name;
      puStack_748 = (uv_loop_t *)0x158391;
      iVar1 = strcmp(dirents[0].name,"file1");
      if (iVar1 != 0) {
        puStack_748 = (uv_loop_t *)0x1583a4;
        iVar1 = strcmp(__s1,"file2");
        if (iVar1 == 0) goto LAB_001583bb;
        puStack_748 = (uv_loop_t *)0x1583b3;
        iVar1 = strcmp(__s1,"test_subdir");
        if (iVar1 == 0) goto LAB_001583bb;
LAB_0015856d:
        puStack_748 = (uv_loop_t *)0x158572;
        run_test_fs_readdir_non_empty_dir_cold_10();
LAB_00158572:
        puStack_748 = (uv_loop_t *)0x158577;
        run_test_fs_readdir_non_empty_dir_cold_12();
        goto LAB_00158577;
      }
LAB_001583bb:
      puStack_748 = (uv_loop_t *)0x1583c6;
      iVar1 = strcmp(__s1,"test_subdir");
      if (iVar1 == 0) {
        if (dirents[0].type == UV_DIRENT_DIR) goto LAB_001583e3;
        goto LAB_00158572;
      }
      if (dirents[0].type != UV_DIRENT_FILE) {
        puStack_748 = (uv_loop_t *)0x15856d;
        run_test_fs_readdir_non_empty_dir_cold_11();
        goto LAB_0015856d;
      }
LAB_001583e3:
      puStack_748 = (uv_loop_t *)0x1583eb;
      uv_fs_req_cleanup(&readdir_req);
      puStack_748 = (uv_loop_t *)0x1583f0;
      puVar2 = uv_default_loop();
      puStack_748 = (uv_loop_t *)0x158400;
      iVar1 = uv_fs_readdir(puVar2,&readdir_req,(uv_dir_t *)loop,(uv_fs_cb)0x0);
      lVar3 = lVar3 + -1;
    } while (iVar1 != 0);
    if (lVar3 != 0) goto LAB_00158577;
    puStack_748 = (uv_loop_t *)0x158420;
    uv_fs_req_cleanup(&readdir_req);
    puStack_748 = (uv_loop_t *)0x158439;
    memset(&closedir_req,0xdb,0x1b8);
    puStack_748 = (uv_loop_t *)0x15843e;
    puVar2 = uv_default_loop();
    puStack_748 = (uv_loop_t *)0x15844e;
    uv_fs_closedir(puVar2,&closedir_req,(uv_dir_t *)loop,(uv_fs_cb)0x0);
    if (closedir_req.result != 0) goto LAB_001585ae;
    puStack_748 = (uv_loop_t *)0x158468;
    uv_fs_req_cleanup(&closedir_req);
    loop = &opendir_req;
    puStack_748 = (uv_loop_t *)0x158481;
    memset(&opendir_req,0xdb,0x1b8);
    puStack_748 = (uv_loop_t *)0x158486;
    puVar2 = uv_default_loop();
    puStack_748 = (uv_loop_t *)0x15849f;
    iVar1 = uv_fs_opendir(puVar2,&opendir_req,"test_dir",non_empty_opendir_cb);
    if (iVar1 != 0) goto LAB_001585b3;
    if (non_empty_opendir_cb_count != 0) goto LAB_001585b8;
    if (non_empty_closedir_cb_count != 0) goto LAB_001585bd;
    puStack_748 = (uv_loop_t *)0x1584c6;
    puVar2 = uv_default_loop();
    puStack_748 = (uv_loop_t *)0x1584d0;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001585c2;
    if (non_empty_opendir_cb_count != 1) goto LAB_001585c7;
    if (non_empty_closedir_cb_count == 1) {
      puStack_748 = (uv_loop_t *)0x1584f7;
      puVar2 = uv_default_loop();
      puStack_748 = (uv_loop_t *)0x158513;
      uv_fs_rmdir(puVar2,&uStack_210,"test_subdir",(uv_fs_cb)0x0);
      puStack_748 = (uv_loop_t *)0x15851b;
      uv_fs_req_cleanup(&uStack_210);
      puStack_748 = (uv_loop_t *)0x158520;
      cleanup_test_files();
      puStack_748 = (uv_loop_t *)0x158525;
      loop = (uv_fs_t *)uv_default_loop();
      puStack_748 = (uv_loop_t *)0x158539;
      uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
      puStack_748 = (uv_loop_t *)0x158543;
      uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
      puStack_748 = (uv_loop_t *)0x158548;
      puVar2 = uv_default_loop();
      puStack_748 = (uv_loop_t *)0x158550;
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_001585d1;
    }
  }
  else {
LAB_0015857c:
    puStack_748 = (uv_loop_t *)0x158581;
    run_test_fs_readdir_non_empty_dir_cold_1();
    req_00 = loop;
LAB_00158581:
    puStack_748 = (uv_loop_t *)0x158586;
    run_test_fs_readdir_non_empty_dir_cold_2();
LAB_00158586:
    puStack_748 = (uv_loop_t *)0x15858b;
    run_test_fs_readdir_non_empty_dir_cold_3();
LAB_0015858b:
    puStack_748 = (uv_loop_t *)0x158590;
    run_test_fs_readdir_non_empty_dir_cold_4();
LAB_00158590:
    puStack_748 = (uv_loop_t *)0x158595;
    run_test_fs_readdir_non_empty_dir_cold_5();
LAB_00158595:
    puStack_748 = (uv_loop_t *)0x15859a;
    run_test_fs_readdir_non_empty_dir_cold_6();
LAB_0015859a:
    puStack_748 = (uv_loop_t *)0x15859f;
    run_test_fs_readdir_non_empty_dir_cold_7();
LAB_0015859f:
    puStack_748 = (uv_loop_t *)0x1585a4;
    run_test_fs_readdir_non_empty_dir_cold_8();
LAB_001585a4:
    loop = req_00;
    puStack_748 = (uv_loop_t *)0x1585a9;
    run_test_fs_readdir_non_empty_dir_cold_9();
LAB_001585a9:
    puStack_748 = (uv_loop_t *)0x1585ae;
    run_test_fs_readdir_non_empty_dir_cold_22();
LAB_001585ae:
    puStack_748 = (uv_loop_t *)0x1585b3;
    run_test_fs_readdir_non_empty_dir_cold_13();
LAB_001585b3:
    puStack_748 = (uv_loop_t *)0x1585b8;
    run_test_fs_readdir_non_empty_dir_cold_14();
LAB_001585b8:
    puStack_748 = (uv_loop_t *)0x1585bd;
    run_test_fs_readdir_non_empty_dir_cold_15();
LAB_001585bd:
    puStack_748 = (uv_loop_t *)0x1585c2;
    run_test_fs_readdir_non_empty_dir_cold_16();
LAB_001585c2:
    puStack_748 = (uv_loop_t *)0x1585c7;
    run_test_fs_readdir_non_empty_dir_cold_17();
LAB_001585c7:
    puStack_748 = (uv_loop_t *)0x1585cc;
    run_test_fs_readdir_non_empty_dir_cold_18();
  }
  puStack_748 = (uv_loop_t *)0x1585d1;
  run_test_fs_readdir_non_empty_dir_cold_19();
LAB_001585d1:
  puStack_748 = (uv_loop_t *)cleanup_test_files;
  run_test_fs_readdir_non_empty_dir_cold_20();
  puStack_748 = (uv_loop_t *)loop;
  uv_fs_unlink((uv_loop_t *)0x0,&uStack_900,"test_dir/file1",(uv_fs_cb)0x0);
  uv_fs_req_cleanup(&uStack_900);
  uv_fs_unlink((uv_loop_t *)0x0,&uStack_900,"test_dir/file2",(uv_fs_cb)0x0);
  uv_fs_req_cleanup(&uStack_900);
  uv_fs_rmdir((uv_loop_t *)0x0,&uStack_900,"test_dir/test_subdir",(uv_fs_cb)0x0);
  uv_fs_req_cleanup(&uStack_900);
  uv_fs_rmdir((uv_loop_t *)0x0,&uStack_900,"test_dir",(uv_fs_cb)0x0);
  uv_fs_req_cleanup(&uStack_900);
  return;
}

Assistant:

static void empty_opendir_cb(uv_fs_t* req) {
  uv_dir_t* dir;
  int r;

  ASSERT(req == &opendir_req);
  ASSERT(req->fs_type == UV_FS_OPENDIR);
  ASSERT(req->result == 0);
  ASSERT(req->ptr != NULL);
  dir = req->ptr;
  dir->dirents = dirents;
  dir->nentries = ARRAY_SIZE(dirents);
  r = uv_fs_readdir(uv_default_loop(),
                    &readdir_req,
                    dir,
                    empty_readdir_cb);
  ASSERT(r == 0);
  uv_fs_req_cleanup(req);
  ++empty_opendir_cb_count;
}